

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

void __thiscall ON_Matrix::Zero(ON_Matrix *this)

{
  int *local_18;
  DBLBLK *cmem;
  ON_Matrix *this_local;
  
  for (local_18 = (int *)this->m_cmem; local_18 != (int *)0x0; local_18 = *(int **)(local_18 + 4)) {
    if ((*(long *)(local_18 + 2) != 0) && (0 < *local_18)) {
      memset(*(void **)(local_18 + 2),0,(long)*local_18 << 3);
    }
    onmalloc(0);
  }
  return;
}

Assistant:

void ON_Matrix::Zero()
{
  struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
  while ( 0 != cmem )
  {
    if ( 0 != cmem->a && cmem->count > 0 )
    {
      memset( cmem->a, 0, cmem->count*sizeof(cmem->a[0]) );
    }
    onmalloc(0);  // allow canceling
    cmem = cmem->next;
  }

  //m_a.Zero();
}